

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.h
# Opt level: O3

void __thiscall
gulcalc::gulcalc(gulcalc *this,
                vector<damagebindictionary,_std::allocator<damagebindictionary>_>
                *damagebindictionary_vec,vector<float,_std::allocator<float>_> *tivs,
                map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
                *item_map,getRands *rnd,getRands *rnd0,_func_void_void_ptr_int_int *itemWriter,
                _func_void_void_ptr_int_int *coverageWriter,_func_void_void_ptr_int_int *lossWriter,
                _func_void_void_ptr_int_int *correlatedWriter,_func_bool_char_ptr_int *iGetrec,
                gulcalcopts *opt)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  double dVar3;
  FILE *pFVar4;
  FILE *pFVar5;
  int iVar6;
  undefined7 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 uVar11;
  bool bVar12;
  uchar *puVar13;
  uint uVar14;
  
  this->rand_seed_ = 0;
  iVar6 = opt->rand_vector_size;
  (this->opt_).rndopt = opt->rndopt;
  (this->opt_).rand_vector_size = iVar6;
  (this->opt_).rand_seed = opt->rand_seed;
  (this->opt_).item_output._M_dataplus._M_p = (pointer)&(this->opt_).item_output.field_2;
  pcVar2 = (opt->item_output)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->opt_).item_output,pcVar2,pcVar2 + (opt->item_output)._M_string_length
            );
  (this->opt_).coverage_output._M_dataplus._M_p = (pointer)&(this->opt_).coverage_output.field_2;
  pcVar2 = (opt->coverage_output)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->opt_).coverage_output,pcVar2,
             pcVar2 + (opt->coverage_output)._M_string_length);
  (this->opt_).correlated_output._M_dataplus._M_p = (pointer)&(this->opt_).correlated_output.field_2
  ;
  pcVar2 = (opt->correlated_output)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->opt_).correlated_output,pcVar2,
             pcVar2 + (opt->correlated_output)._M_string_length);
  *(undefined8 *)((long)&(this->opt_).corrout + 5) = *(undefined8 *)((long)&opt->corrout + 5);
  bVar8 = opt->itemLevelOutput;
  bVar9 = opt->coverageLevelOutput;
  bVar10 = opt->correlatedLevelOutput;
  uVar11 = opt->field_0x73;
  iVar6 = opt->samplesize;
  dVar3 = opt->loss_threshold;
  bVar12 = opt->debug;
  uVar7 = *(undefined7 *)&opt->field_0x81;
  pFVar4 = opt->itemout;
  pFVar5 = opt->corrout;
  (this->opt_).covout = opt->covout;
  (this->opt_).corrout = pFVar5;
  (this->opt_).debug = bVar12;
  *(undefined7 *)&(this->opt_).field_0x81 = uVar7;
  (this->opt_).itemout = pFVar4;
  (this->opt_).itemLevelOutput = bVar8;
  (this->opt_).coverageLevelOutput = bVar9;
  (this->opt_).correlatedLevelOutput = bVar10;
  (this->opt_).field_0x73 = uVar11;
  (this->opt_).samplesize = iVar6;
  (this->opt_).loss_threshold = dVar3;
  this->num_idx_ = 5;
  p_Var1 = &(this->bin_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->bin_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bin_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cov_).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cov_).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cov_).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mode1_).
  super__Vector_base<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mode1_).
  super__Vector_base<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mode1_).
  super__Vector_base<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fullCorr_).
  super__Vector_base<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fullCorr_).
  super__Vector_base<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fullCorr_).
  super__Vector_base<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mode1_stats_).
  super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mode1_stats_).
  super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mode1_stats_).
  super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bin_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bin_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->itembufoffset_ = 0;
  this->correlatedbufoffset_ = 0;
  this->covbufoffset_ = 0;
  (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bin_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->damagebindictionary_vec_ = damagebindictionary_vec;
  this->coverages_ = tivs;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::resize(&this->cov_,
           (long)(tivs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(tivs->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2);
  if (0 < opt->allocRule) {
    std::
    vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
    ::resize(&this->mode1_,
             (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
    std::
    vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
    ::resize(&this->mode1_stats_,
             (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  }
  if (opt->correlatedLevelOutput == true) {
    std::
    vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
    ::resize(&this->fullCorr_,
             (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  }
  this->item_map_ = item_map;
  this->rnd_ = rnd;
  this->rnd0_ = rnd0;
  this->itemWriter_ = itemWriter;
  this->coverageWriter_ = coverageWriter;
  this->lossWriter_ = lossWriter;
  this->correlatedWriter_ = correlatedWriter;
  this->iGetrec_ = iGetrec;
  puVar13 = (uchar *)operator_new__(0x3e90);
  this->ibuf_ = puVar13;
  puVar13 = (uchar *)operator_new__(0x3e90);
  this->corrbuf_ = puVar13;
  puVar13 = (uchar *)operator_new__(0x3e90);
  this->cbuf_ = puVar13;
  this->alloc_rule_ = opt->allocRule;
  this->loss_threshold_ = opt->loss_threshold;
  this->rndopt_ = opt->rndopt;
  this->debug_ = opt->debug;
  this->benchmark_ = opt->benchmark;
  this->samplesize_ = opt->samplesize;
  this->isFirstItemEvent_ = true;
  this->isFirstCorrelatedEvent_ = true;
  this->isFirstCovEvent_ = true;
  uVar14 = rnd->buffersize_ >> 1;
  do {
    uVar14 = uVar14 + 1;
    bVar12 = isPrime(uVar14);
  } while (!bVar12);
  this->p1_ = (ulong)uVar14;
  do {
    uVar14 = uVar14 + 1;
    bVar12 = isPrime(uVar14);
  } while (!bVar12);
  this->p2_ = (ulong)uVar14;
  uVar14 = this->samplesize_;
  do {
    uVar14 = uVar14 + 1;
    bVar12 = isPrime(uVar14);
  } while (!bVar12);
  this->p3_ = (ulong)uVar14;
  this->rand_seed_ = opt->rand_seed;
  return;
}

Assistant:

gulcalc(const std::vector<damagebindictionary> &damagebindictionary_vec,const std::vector<OASIS_FLOAT> &tivs,
		const std::map<item_map_key, std::vector<item_map_rec> > &item_map, getRands &rnd, getRands &rnd0, 		
		void (*itemWriter)(const void *ibuf,int size, int count),
		void(*coverageWriter)(const void *ibuf,int size, int count),
		void (*lossWriter)(const void *ibuf, int size, int count),
		void(*correlatedWriter)(const void *ibuf, int size, int count),
		bool(*iGetrec)(char *rec, int recsize),
		const gulcalcopts& opt
		): opt_(opt) {
			damagebindictionary_vec_ = &damagebindictionary_vec;
			coverages_ = &tivs;
			cov_.resize(coverages_->size());
			if (opt.allocRule > 0) {
				mode1_.resize(coverages_->size());
				mode1_stats_.resize(coverages_->size());
			}
			if (opt.correlatedLevelOutput == true) {
				fullCorr_.resize(coverages_->size());
			}
			item_map_ = &item_map;
			rnd_ = &rnd;
			rnd0_ = &rnd0;

			itemWriter_ = itemWriter;
			coverageWriter_ = coverageWriter;
        		lossWriter_ = lossWriter;
			correlatedWriter_ = correlatedWriter;
			iGetrec_ = iGetrec;
			ibuf_ = new unsigned char[bufsize + sizeof(gulitemSampleslevel)]; // make the allocation bigger by 1 record to avoid overrunning
			corrbuf_ = new unsigned char[bufsize + sizeof(gulitemSampleslevel)];   // make the allocation bigger by 1 record to avoid overrunning
			cbuf_ = new unsigned char[bufsize + sizeof(gulitemSampleslevel)]; // make the allocation bigger by 1 record to avoid overrunning
			//TODO: when using double precision, these buffers above are overflowing,
			//the hack fix is to replace sizeof(gulitemSampleslevel) with 2*sizeof(gulitemSampleslevel)
			alloc_rule_ = opt.allocRule;
			loss_threshold_ = opt.loss_threshold;
			rndopt_ = opt.rndopt;				
			debug_ = opt.debug;
			benchmark_ = opt.benchmark;
			samplesize_ = opt.samplesize;
			isFirstItemEvent_ = true;
			isFirstCorrelatedEvent_ = true;
			isFirstCovEvent_ = true;
			p1_ = rnd_->getp1();	// prime p1	make these long to force below expression to not have sign problem
			p2_ = rnd_->getp2((unsigned int)p1_);  // prime no p2
			p3_ = rnd_->getp2((unsigned int)samplesize_);	// use as additional offset to stop overlapping of random numbers 
			rand_seed_ = opt.rand_seed;
	}